

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

int AF_AActor_A_PlayerScream
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *actor;
  PClass *pPVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  player_t *ppVar5;
  FSoundID *sound_id;
  int channel;
  char *__assertion;
  uint uVar6;
  bool bVar7;
  FSoundID local_30;
  FSoundID local_2c;
  FSoundID local_28;
  FSoundID local_24;
  PClass *pPVar4;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
LAB_0046c1f3:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                  ,0x641,
                  "int AF_AActor_A_PlayerScream(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (((param->field_0).field_3.Type != '\x03') || ((param->field_0).field_1.atag != 1)) {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_0046c1f3;
  }
  actor = *(AActor **)&param->field_0;
  pPVar4 = (actor->super_DThinker).super_DObject.Class;
  if (pPVar4 == (PClass *)0x0) {
    iVar2 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
    pPVar4 = (PClass *)CONCAT44(extraout_var,iVar2);
    (actor->super_DThinker).super_DObject.Class = pPVar4;
  }
  bVar7 = pPVar4 != (PClass *)0x0;
  if (pPVar4 != pPVar1 && bVar7) {
    do {
      pPVar4 = pPVar4->ParentClass;
      bVar7 = pPVar4 != (PClass *)0x0;
      if (pPVar4 == pPVar1) break;
    } while (pPVar4 != (PClass *)0x0);
  }
  if (!bVar7) {
    __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
    goto LAB_0046c1f3;
  }
  ppVar5 = actor->player;
  iVar2 = (actor->DeathSound).super_FSoundID.ID;
  if (ppVar5 == (player_t *)0x0) {
    if (iVar2 != 0) goto LAB_0046c023;
    local_28.ID = S_FindSound("*death");
    sound_id = &local_28;
  }
  else {
    if (iVar2 == 0) {
      iVar2 = 2;
      if ((((level.flags >> 0xf | dmflags.Value) & 0x18) == 0) || (-39.0 < (actor->Vel).Z)) {
LAB_0046c061:
        if (actor->special1 < 10) {
          iVar3 = S_FindSkinnedSoundEx
                            (actor,"*wimpydeath",
                             FName::NameData.NameArray[(ppVar5->LastDamageType).Index].Text);
          if (iVar3 == 0) {
            ppVar5 = actor->player;
            goto LAB_0046c0a2;
          }
        }
        else {
LAB_0046c0a2:
          if (actor->health < -0x31) {
            if (0xffffff9c < (uint)actor->health) {
              iVar3 = S_FindSkinnedSoundEx
                                (actor,"*crazydeath",
                                 FName::NameData.NameArray[(ppVar5->LastDamageType).Index].Text);
              if (iVar3 != 0) goto LAB_0046c182;
              ppVar5 = actor->player;
            }
            iVar3 = S_FindSkinnedSoundEx
                              (actor,"*xdeath",
                               FName::NameData.NameArray[(ppVar5->LastDamageType).Index].Text);
            if (iVar3 != 0) goto LAB_0046c182;
            iVar3 = S_FindSkinnedSoundEx
                              (actor,"*gibbed",
                               FName::NameData.NameArray[(actor->player->LastDamageType).Index].Text
                              );
            if (iVar3 != 0) goto LAB_0046c012;
            ppVar5 = actor->player;
            iVar2 = 4;
          }
          iVar3 = S_FindSkinnedSoundEx
                            (actor,"*death",
                             FName::NameData.NameArray[(ppVar5->LastDamageType).Index].Text);
        }
LAB_0046c182:
        channel = 2;
        if (iVar2 != 2) goto LAB_0046c18f;
      }
      else {
        local_2c.ID = S_FindSound("*splat");
        iVar3 = S_FindSkinnedSound(actor,&local_2c);
        if (iVar3 == 0) {
          ppVar5 = actor->player;
          iVar2 = 4;
          goto LAB_0046c061;
        }
LAB_0046c012:
        iVar2 = 4;
LAB_0046c18f:
        uVar6 = 0xfffffffd;
        do {
          if (uVar6 < 0xfffffffe) {
            S_StopSound(actor,uVar6 + 3);
          }
          uVar6 = uVar6 + 1;
          channel = iVar2;
        } while (uVar6 != 5);
      }
      sound_id = &local_30;
      local_30.ID = iVar3;
      goto LAB_0046c1c5;
    }
LAB_0046c023:
    sound_id = &local_24;
    local_24.ID = iVar2;
  }
  channel = 2;
LAB_0046c1c5:
  S_Sound(actor,channel,sound_id,1.0,1.0);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_PlayerScream)
{
	PARAM_SELF_PROLOGUE(AActor);

	int sound = 0;
	int chan = CHAN_VOICE;

	if (self->player == NULL || self->DeathSound != 0)
	{
		if (self->DeathSound != 0)
		{
			S_Sound (self, CHAN_VOICE, self->DeathSound, 1, ATTN_NORM);
		}
		else
		{
			S_Sound (self, CHAN_VOICE, "*death", 1, ATTN_NORM);
		}
		return 0;
	}

	// Handle the different player death screams
	if ((((level.flags >> 15) | (dmflags)) &
		(DF_FORCE_FALLINGZD | DF_FORCE_FALLINGHX)) &&
		self->Vel.Z <= -39)
	{
		sound = S_FindSkinnedSound (self, "*splat");
		chan = CHAN_BODY;
	}

	if (!sound && self->special1<10)
	{ // Wimpy death sound
		sound = S_FindSkinnedSoundEx (self, "*wimpydeath", self->player->LastDamageType);
	}
	if (!sound && self->health <= -50)
	{
		if (self->health > -100)
		{ // Crazy death sound
			sound = S_FindSkinnedSoundEx (self, "*crazydeath", self->player->LastDamageType);
		}
		if (!sound)
		{ // Extreme death sound
			sound = S_FindSkinnedSoundEx (self, "*xdeath", self->player->LastDamageType);
			if (!sound)
			{
				sound = S_FindSkinnedSoundEx (self, "*gibbed", self->player->LastDamageType);
				chan = CHAN_BODY;
			}
		}
	}
	if (!sound)
	{ // Normal death sound
		sound = S_FindSkinnedSoundEx (self, "*death", self->player->LastDamageType);
	}

	if (chan != CHAN_VOICE)
	{
		for (int i = 0; i < 8; ++i)
		{ // Stop most playing sounds from this player.
		  // This is mainly to stop *land from messing up *splat.
			if (i != CHAN_WEAPON && i != CHAN_VOICE)
			{
				S_StopSound (self, i);
			}
		}
	}
	S_Sound (self, chan, sound, 1, ATTN_NORM);
	return 0;
}